

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void smooth_pred_4xh(__m128i *pixel,__m128i *wh,__m128i *ww,int h,uint8_t *dst,ptrdiff_t stride,
                    int second_half)

{
  int iVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar15 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  auVar3 = _DAT_00b97a00;
  if (second_half != 0) {
    auVar3 = _DAT_00b97c60;
  }
  iVar1 = 0;
  if (0 < h) {
    iVar1 = h;
  }
  auVar4 = _DAT_00b97c70;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    auVar5 = pshufb((undefined1  [16])*wh,auVar4);
    auVar10 = pshufb((undefined1  [16])wh[1],auVar4);
    auVar9._0_12_ = auVar5._0_12_;
    auVar9._12_2_ = auVar5._6_2_;
    auVar9._14_2_ = auVar10._6_2_;
    auVar8._12_4_ = auVar9._12_4_;
    auVar8._0_10_ = auVar5._0_10_;
    auVar8._10_2_ = auVar10._4_2_;
    auVar7._10_6_ = auVar8._10_6_;
    auVar7._0_8_ = auVar5._0_8_;
    auVar7._8_2_ = auVar5._4_2_;
    auVar6._8_8_ = auVar7._8_8_;
    auVar6._6_2_ = auVar10._2_2_;
    auVar6._4_2_ = auVar5._2_2_;
    auVar6._0_2_ = auVar5._0_2_;
    auVar6._2_2_ = auVar10._0_2_;
    auVar5 = pmaddwd(auVar6,(undefined1  [16])*pixel);
    auVar10 = pshufb((undefined1  [16])pixel[1],auVar3);
    auVar14._0_12_ = auVar10._0_12_;
    auVar14._12_2_ = auVar10._6_2_;
    auVar14._14_2_ = *(undefined2 *)((long)pixel[2] + 6);
    auVar13._12_4_ = auVar14._12_4_;
    auVar13._0_10_ = auVar10._0_10_;
    auVar13._10_2_ = *(undefined2 *)((long)pixel[2] + 4);
    auVar12._10_6_ = auVar13._10_6_;
    auVar12._0_8_ = auVar10._0_8_;
    auVar12._8_2_ = auVar10._4_2_;
    auVar11._8_8_ = auVar12._8_8_;
    auVar11._6_2_ = *(undefined2 *)((long)pixel[2] + 2);
    auVar11._4_2_ = auVar10._2_2_;
    auVar11._0_2_ = auVar10._0_2_;
    auVar11._2_2_ = (short)pixel[2][0];
    auVar10 = pmaddwd(auVar11,(undefined1  [16])*ww);
    auVar15._0_4_ = auVar10._0_4_ + auVar5._0_4_ + 0x100U >> 9;
    auVar15._4_4_ = auVar10._4_4_ + auVar5._4_4_ + 0x100U >> 9;
    auVar15._8_4_ = auVar10._8_4_ + auVar5._8_4_ + 0x100U >> 9;
    auVar15._12_4_ = auVar10._12_4_ + auVar5._12_4_ + 0x100U >> 9;
    auVar5 = pshufb(auVar15,ZEXT416(0xc080400));
    *(int *)dst = auVar5._0_4_;
    dst = dst + stride;
    auVar5._0_2_ = auVar3._0_2_ + 1;
    auVar5._2_2_ = auVar3._2_2_ + 1;
    auVar5._4_2_ = auVar3._4_2_ + 1;
    auVar5._6_2_ = auVar3._6_2_ + 1;
    auVar5._8_2_ = auVar3._8_2_ + 1;
    auVar5._10_2_ = auVar3._10_2_ + 1;
    auVar5._12_2_ = auVar3._12_2_ + 1;
    auVar5._14_2_ = auVar3._14_2_ + 1;
    auVar10._0_2_ = auVar4._0_2_ + 0x202;
    auVar10._2_2_ = auVar4._2_2_ + 0x202;
    auVar10._4_2_ = auVar4._4_2_ + 0x202;
    auVar10._6_2_ = auVar4._6_2_ + 0x202;
    auVar10._8_2_ = auVar4._8_2_ + 0x202;
    auVar10._10_2_ = auVar4._10_2_ + 0x202;
    auVar10._12_2_ = auVar4._12_2_ + 0x202;
    auVar10._14_2_ = auVar4._14_2_ + 0x202;
    auVar3 = auVar5;
    auVar4 = auVar10;
  }
  return;
}

Assistant:

static inline void smooth_pred_4xh(const __m128i *pixel, const __m128i *wh,
                                   const __m128i *ww, int h, uint8_t *dst,
                                   ptrdiff_t stride, int second_half) {
  const __m128i round = _mm_set1_epi32((1 << SMOOTH_WEIGHT_LOG2_SCALE));
  const __m128i one = _mm_set1_epi16(1);
  const __m128i inc = _mm_set1_epi16(0x202);
  const __m128i gat = _mm_set1_epi32(0xc080400);
  __m128i rep = second_half ? _mm_set1_epi16((short)0x8008)
                            : _mm_set1_epi16((short)0x8000);
  __m128i d = _mm_set1_epi16(0x100);

  for (int i = 0; i < h; ++i) {
    const __m128i wg_wg = _mm_shuffle_epi8(wh[0], d);
    const __m128i sc_sc = _mm_shuffle_epi8(wh[1], d);
    const __m128i wh_sc = _mm_unpacklo_epi16(wg_wg, sc_sc);
    __m128i s = _mm_madd_epi16(pixel[0], wh_sc);

    __m128i b = _mm_shuffle_epi8(pixel[1], rep);
    b = _mm_unpacklo_epi16(b, pixel[2]);
    __m128i sum = _mm_madd_epi16(b, ww[0]);

    sum = _mm_add_epi32(s, sum);
    sum = _mm_add_epi32(sum, round);
    sum = _mm_srai_epi32(sum, 1 + SMOOTH_WEIGHT_LOG2_SCALE);

    sum = _mm_shuffle_epi8(sum, gat);
    *(int *)dst = _mm_cvtsi128_si32(sum);
    dst += stride;

    rep = _mm_add_epi16(rep, one);
    d = _mm_add_epi16(d, inc);
  }
}